

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

int Gia_ManBmcAssignVarIds(Bmc_Mna_t *p,Vec_Int_t *vIns,Vec_Int_t *vUsed,Vec_Int_t *vOuts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int VarC0;
  int iObj;
  int i;
  Vec_Int_t *vOuts_local;
  Vec_Int_t *vUsed_local;
  Vec_Int_t *vIns_local;
  Bmc_Mna_t *p_local;
  
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  for (VarC0 = 0; iVar2 = Vec_IntSize(vIns), VarC0 < iVar2; VarC0 = VarC0 + 1) {
    iVar2 = Vec_IntEntry(vIns,VarC0);
    iVar3 = Vec_IntEntry(p->vId2Var,iVar2);
    if (iVar3 == 0) {
      iVar3 = p->nSatVars;
      p->nSatVars = iVar3 + 1;
      Vec_IntWriteEntry(p->vId2Var,iVar2,iVar3);
    }
  }
  VarC0 = Vec_IntSize(vUsed);
  while (VarC0 = VarC0 + -1, -1 < VarC0) {
    iVar2 = Vec_IntEntry(vUsed,VarC0);
    iVar3 = Vec_IntEntry(p->vId2Var,iVar2);
    if (iVar3 != 0) {
      __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0x1db,
                    "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar3 = p->nSatVars;
    p->nSatVars = iVar3 + 1;
    Vec_IntWriteEntry(p->vId2Var,iVar2,iVar3);
  }
  VarC0 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vOuts);
    if (iVar2 <= VarC0) {
      iVar2 = p->nSatVars;
      iVar3 = sat_solver_nvars(p->pSat);
      if (iVar3 < iVar2) {
        sat_solver_setnvars(p->pSat,p->nSatVars);
      }
      return iVar1;
    }
    iVar2 = Vec_IntEntry(vOuts,VarC0);
    iVar3 = Vec_IntEntry(p->vId2Var,iVar2);
    if (iVar3 != 0) break;
    iVar3 = p->nSatVars;
    p->nSatVars = iVar3 + 1;
    Vec_IntWriteEntry(p->vId2Var,iVar2,iVar3);
    VarC0 = VarC0 + 1;
  }
  __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                ,0x1e0,
                "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Gia_ManBmcAssignVarIds( Bmc_Mna_t * p, Vec_Int_t * vIns, Vec_Int_t * vUsed, Vec_Int_t * vOuts )
{
    int i, iObj = 0, VarC0 = p->nSatVars++;
    Vec_IntForEachEntry( vIns, iObj, i )
        if ( Vec_IntEntry( p->vId2Var, iObj ) == 0 )
            Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    Vec_IntForEachEntryReverse( vUsed, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    Vec_IntForEachEntry( vOuts, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    // extend the SAT solver
    if ( p->nSatVars > sat_solver_nvars(p->pSat) )
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return VarC0;
}